

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManifestTest.cpp
# Opt level: O2

string * normalize(string *__return_storage_ptr__,string *workingDirectory,string *path0)

{
  char *S;
  bool bVar1;
  SmallVectorImpl<char> *in_RCX;
  StringRef workingDirectory_00;
  StringRef local_140;
  SmallString<256U> absPathTmp;
  
  S = (path0->_M_dataplus)._M_p;
  llvm::SmallVector<char,256u>::SmallVector<char_const*,void>
            (&absPathTmp.super_SmallVector<char,_256U>,S,S + path0->_M_string_length);
  workingDirectory_00.Length = (size_t)&absPathTmp.super_SmallVector<char,_256U>;
  workingDirectory_00.Data = (char *)workingDirectory->_M_string_length;
  bVar1 = llbuild::ninja::Manifest::normalize_path
                    ((Manifest *)(workingDirectory->_M_dataplus)._M_p,workingDirectory_00,in_RCX);
  if (bVar1) {
    local_140.Length =
         (size_t)absPathTmp.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                 super_SmallVectorTemplateBase<char,_true>.
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
    if (workingDirectory->_M_string_length + path0->_M_string_length + 2 <= local_140.Length) {
      __assert_fail("absPathTmp.size() < workingDirectory.size() + 1 + path0.size() + 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/ManifestTest.cpp"
                    ,0x1c,"std::string normalize(std::string, std::string)");
    }
    local_140.Data =
         (char *)absPathTmp.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                 super_SmallVectorTemplateBase<char,_true>.
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
    llvm::StringRef::str_abi_cxx11_(__return_storage_ptr__,&local_140);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"<failed to normalize>",(allocator *)&local_140);
  }
  llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&absPathTmp);
  return __return_storage_ptr__;
}

Assistant:

static std::string normalize(std::string workingDirectory, std::string path0) {
  SmallString<256> absPathTmp = StringRef(path0);
  if (!Manifest::normalize_path(workingDirectory, absPathTmp)) {
    return "<failed to normalize>";
  }
  assert(absPathTmp.size() < workingDirectory.size() + 1 + path0.size() + 1);
  return absPathTmp.str();
}